

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_proto2_unittest.pb.h
# Opt level: O2

TestMaps * __thiscall
proto2_unittest::TestSubmessageMaps::_internal_mutable_m(TestSubmessageMaps *this)

{
  TestMaps *pTVar1;
  Arena *arena;
  
  pTVar1 = (this->field_0)._impl_.m_;
  if (pTVar1 != (TestMaps *)0x0) {
    return pTVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pTVar1 = (TestMaps *)google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestMaps>(arena);
  (this->field_0)._impl_.m_ = pTVar1;
  return pTVar1;
}

Assistant:

inline ::proto2_unittest::TestMaps* PROTOBUF_NONNULL TestSubmessageMaps::_internal_mutable_m() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.m_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestMaps>(GetArena());
    _impl_.m_ = reinterpret_cast<::proto2_unittest::TestMaps*>(p);
  }
  return _impl_.m_;
}